

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::constraineddelaunay(tetgenmesh *this,clock_t *tv)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  unsigned_long uVar5;
  clock_t cVar6;
  uint uVar7;
  long bakseg_ref_count;
  long bakcavityexpcount;
  long bakcavitycount;
  long bakfillregioncount;
  int i;
  int s;
  face *paryseg;
  face searchseg;
  face *parysh;
  face searchsh;
  clock_t *tv_local;
  tetgenmesh *this_local;
  
  searchsh._8_8_ = tv;
  face::face((face *)&parysh);
  face::face((face *)&paryseg);
  if (this->b->quiet == 0) {
    printf("Constrained Delaunay...\n");
  }
  makesegmentendpointsmap(this);
  makefacetverticesmap(this);
  if (this->b->verbose != 0) {
    printf("  Delaunizing segments.\n");
  }
  this->checksubsegflag = 1;
  memorypool::traversalinit(this->subsegs);
  for (bakfillregioncount._0_4_ = 0; (long)(int)bakfillregioncount < this->subsegs->items;
      bakfillregioncount._0_4_ = (int)bakfillregioncount + 1) {
    uVar5 = randomnation(this,(int)bakfillregioncount + 1);
    uVar7 = (uint)uVar5;
    arraypool::newindex(this->subsegstack,(void **)&i);
    face::operator=(_i,(face *)(this->subsegstack->toparray
                                [(int)uVar7 >> ((byte)this->subsegstack->log2objectsperblock & 0x1f)
                                ] + (int)((uVar7 & this->subsegstack->objectsperblockmark) *
                                         this->subsegstack->objectbytes)));
    paryseg = (face *)shellfacetraverse(this,this->subsegs);
    _i = (face *)(this->subsegstack->toparray
                  [(int)uVar7 >> ((byte)this->subsegstack->log2objectsperblock & 0x1f)] +
                 (int)((uVar7 & this->subsegstack->objectsperblockmark) *
                      this->subsegstack->objectbytes));
    face::operator=(_i,(face *)&paryseg);
  }
  delaunizesegments(this);
  if (this->b->verbose != 0) {
    printf("  Inserted %ld Steiner points.\n",this->st_segref_count);
  }
  cVar6 = clock();
  *(clock_t *)searchsh._8_8_ = cVar6;
  if (this->b->verbose != 0) {
    printf("  Constraining facets.\n");
  }
  this->checksubfaceflag = 1;
  lVar1 = this->fillregioncount;
  lVar2 = this->cavitycount;
  lVar3 = this->cavityexpcount;
  lVar4 = this->st_segref_count;
  memorypool::traversalinit(this->subfaces);
  for (bakfillregioncount._0_4_ = 0; (long)(int)bakfillregioncount < this->subfaces->items;
      bakfillregioncount._0_4_ = (int)bakfillregioncount + 1) {
    uVar5 = randomnation(this,(int)bakfillregioncount + 1);
    uVar7 = (uint)uVar5;
    arraypool::newindex(this->subfacstack,(void **)&searchseg.shver);
    face::operator=((face *)searchseg._8_8_,
                    (face *)(this->subfacstack->toparray
                             [(int)uVar7 >> ((byte)this->subfacstack->log2objectsperblock & 0x1f)] +
                            (int)((uVar7 & this->subfacstack->objectsperblockmark) *
                                 this->subfacstack->objectbytes)));
    parysh = (face *)shellfacetraverse(this,this->subfaces);
    searchseg._8_8_ =
         this->subfacstack->toparray
         [(int)uVar7 >> ((byte)this->subfacstack->log2objectsperblock & 0x1f)] +
         (int)((uVar7 & this->subfacstack->objectsperblockmark) * this->subfacstack->objectbytes);
    face::operator=((face *)searchseg._8_8_,(face *)&parysh);
  }
  constrainedfacets(this);
  if (this->b->verbose != 0) {
    if (lVar1 < this->fillregioncount) {
      printf("  Remeshed %ld regions.\n",this->fillregioncount - lVar1);
    }
    if (lVar2 < this->cavitycount) {
      printf("  Remeshed %ld cavities",this->cavitycount - lVar2);
      if (this->cavityexpcount != lVar3) {
        printf(" (%ld enlarged)",this->cavityexpcount - lVar3);
      }
      printf(".\n");
    }
    if (0 < (this->st_segref_count + this->st_facref_count) - lVar4) {
      printf("  Inserted %ld (%ld, %ld) refine points.\n",
             (this->st_segref_count + this->st_facref_count) - lVar4,this->st_segref_count - lVar4,
             this->st_facref_count);
    }
  }
  return;
}

Assistant:

void tetgenmesh::constraineddelaunay(clock_t& tv)
{
  face searchsh, *parysh;
  face searchseg, *paryseg;
  int s, i;

  // Statistics.
  long bakfillregioncount;
  long bakcavitycount, bakcavityexpcount;
  long bakseg_ref_count;

  if (!b->quiet) {
    printf("Constrained Delaunay...\n");
  }

  makesegmentendpointsmap();
  makefacetverticesmap();

  if (b->verbose) {
    printf("  Delaunizing segments.\n");
  }

  checksubsegflag = 1;

  // Put all segments into the list (in random order).
  subsegs->traversalinit();
  for (i = 0; i < subsegs->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th seg to the i-th.
    subsegstack->newindex((void **) &paryseg);
    *paryseg = * (face *) fastlookup(subsegstack, s);
    // Put i-th seg to be the s-th.
    searchseg.sh = shellfacetraverse(subsegs);
    //sinfect(searchseg);  // Only save it once.
    paryseg = (face *) fastlookup(subsegstack, s);
    *paryseg = searchseg;
  }

  // Recover non-Delaunay segments.
  delaunizesegments();

  if (b->verbose) {
    printf("  Inserted %ld Steiner points.\n", st_segref_count); 
  }

  tv = clock();

  if (b->verbose) {
    printf("  Constraining facets.\n");
  }

  // Subfaces will be introduced.
  checksubfaceflag = 1;

  bakfillregioncount = fillregioncount;
  bakcavitycount = cavitycount;
  bakcavityexpcount = cavityexpcount;
  bakseg_ref_count = st_segref_count;

  // Randomly order the subfaces.
  subfaces->traversalinit();
  for (i = 0; i < subfaces->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th subface to the i-th.
    subfacstack->newindex((void **) &parysh);
    *parysh = * (face *) fastlookup(subfacstack, s);
    // Put i-th subface to be the s-th.
    searchsh.sh = shellfacetraverse(subfaces);
    parysh = (face *) fastlookup(subfacstack, s);
    *parysh = searchsh;
  }

  // Recover facets.
  constrainedfacets();

  if (b->verbose) {
    if (fillregioncount > bakfillregioncount) {
      printf("  Remeshed %ld regions.\n", fillregioncount-bakfillregioncount);
    }
    if (cavitycount > bakcavitycount) {
      printf("  Remeshed %ld cavities", cavitycount - bakcavitycount);
      if (cavityexpcount - bakcavityexpcount) {
        printf(" (%ld enlarged)", cavityexpcount - bakcavityexpcount);
      }
      printf(".\n");
    }
    if (st_segref_count + st_facref_count - bakseg_ref_count > 0) {
      printf("  Inserted %ld (%ld, %ld) refine points.\n", 
             st_segref_count + st_facref_count - bakseg_ref_count,
             st_segref_count - bakseg_ref_count, st_facref_count);
    }
  }
}